

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::trapIfGt
          (ModuleRunnerBase<wasm::ModuleRunner> *this,uint64_t lhs,uint64_t rhs,char *msg)

{
  ExternalInterface *pEVar1;
  ostream *poVar2;
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [376];
  undefined8 local_48 [4];
  
  if (rhs < lhs) {
    std::__cxx11::stringstream::stringstream(local_1d0);
    poVar2 = std::operator<<(local_1c0,msg);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," > ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    pEVar1 = this->externalInterface;
    std::__cxx11::stringbuf::str();
    (*pEVar1->_vptr_ExternalInterface[8])(pEVar1,local_48[0]);
    std::__cxx11::string::~string((string *)local_48);
    std::__cxx11::stringstream::~stringstream(local_1d0);
  }
  return;
}

Assistant:

void trapIfGt(uint64_t lhs, uint64_t rhs, const char* msg) {
    if (lhs > rhs) {
      std::stringstream ss;
      ss << msg << ": " << lhs << " > " << rhs;
      externalInterface->trap(ss.str().c_str());
    }
  }